

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O1

Bool prvTidyIsValidHTMLID(ctmbstr id)

{
  char cVar1;
  Bool BVar2;
  
  if (id != (ctmbstr)0x0) {
    do {
      cVar1 = *id;
      if (cVar1 == '\0') {
        return yes;
      }
      id = id + 1;
      BVar2 = prvTidyIsHTMLSpace((int)cVar1);
    } while (BVar2 == no);
  }
  return no;
}

Assistant:

Bool TY_(IsValidHTMLID)(ctmbstr id)
{
    ctmbstr s = id;

    if (!s)
        return no;

    while (*s)
        if (TY_(IsHTMLSpace)(*s++))
            return no;

    return yes;

}